

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_testing::NiceMock<MockNLHandler>_>
                  *this,int opcode)

{
  Kind KVar1;
  BinaryReader<mp::internal::IdentityConverter> *pBVar2;
  CountExpr CVar3;
  int iVar4;
  AssertionFailure *this_00;
  char *pcVar5;
  MockNLHandler *pMVar6;
  NumberOfArgHandler args;
  undefined8 local_48;
  undefined8 uStack_40;
  ArgList local_30;
  
  local_30.field_1.values_ = (Value *)&local_48;
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr(this);
    pBVar2 = this->reader_;
    pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
    ReadNumericExpr(this,*pcVar5,false);
    pBVar2 = this->reader_;
    pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
    ReadNumericExpr(this,*pcVar5,false);
    pMVar6 = &this->handler_->super_MockNLHandler;
    pcVar5 = "if expression";
    break;
  case PLTERM:
    iVar4 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    if (iVar4 < 2) {
      local_48 = 0;
      uStack_40 = 0;
      local_30.types_ = 0;
      local_30.field_1.values_ = (Value *)&local_48;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x261c4a,&local_30);
    }
    MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"piecewise-linear term");
    iVar4 = iVar4 + -1;
    do {
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadConstant(this,*pcVar5);
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadConstant(this,*pcVar5);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    pBVar2 = this->reader_;
    pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
    ReadConstant(this,*pcVar5);
    pMVar6 = &this->handler_->super_MockNLHandler;
    ReadReference(this);
    pcVar5 = "piecewise-linear term";
    break;
  case CALL:
  case LAST_VARARG:
switchD_001c49fb_caseD_29:
    local_48 = 0;
    uStack_40 = 0;
    local_30.types_ = 0;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x264f7a,&local_30);
  case FIRST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"vararg expression");
    if (0 < iVar4) {
      do {
        pBVar2 = this->reader_;
        pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
        ReadNumericExpr(this,*pcVar5,false);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    pMVar6 = &this->handler_->super_MockNLHandler;
    pcVar5 = "vararg expression";
    break;
  case SUM:
    iVar4 = ReadNumArgs(this,3);
    MockNLHandler::OnUnhandled(&this->handler_->super_MockNLHandler,"summation");
    if (0 < iVar4) {
      do {
        pBVar2 = this->reader_;
        pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
        ReadNumericExpr(this,*pcVar5,false);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    pMVar6 = &this->handler_->super_MockNLHandler;
    pcVar5 = "summation";
    break;
  case LAST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    pBVar2 = this->reader_;
    pMVar6 = &this->handler_->super_MockNLHandler;
    pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
    ReadNumericExpr(this,*pcVar5,false);
    MockNLHandler::OnUnhandled(pMVar6,"numberof expression");
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,testing::NiceMock<MockNLHandler>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,testing::NiceMock<MockNLHandler>>::NumericExprReader,mp::NLHandler<MockNLHandler,BasicTestExpr<0>>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,testing::NiceMock<MockNLHandler>>
                *)this,iVar4 + -1,(ArgHandler *)&local_48);
    pMVar6 = &this->handler_->super_MockNLHandler;
    pcVar5 = "numberof expression";
    break;
  case NUMBEROF_SYM:
    iVar4 = ReadNumArgs(this,1);
    pMVar6 = &this->handler_->super_MockNLHandler;
    ReadSymbolicExpr(this);
    MockNLHandler::OnUnhandled(pMVar6,"symbolic numberof expression");
    if (1 < iVar4) {
      iVar4 = iVar4 + -1;
      do {
        ReadSymbolicExpr(this);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    pMVar6 = &this->handler_->super_MockNLHandler;
    pcVar5 = "symbolic numberof expression";
    break;
  case COUNT:
    CVar3 = ReadCountExpr(this);
    return (NumericExpr)CVar3.id_;
  default:
    if (KVar1 == ADD) {
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadNumericExpr(this,*pcVar5,false);
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadNumericExpr(this,*pcVar5,false);
      pMVar6 = &this->handler_->super_MockNLHandler;
      pcVar5 = "binary expression";
    }
    else {
      if (KVar1 != FIRST_UNARY) goto switchD_001c49fb_caseD_29;
      pBVar2 = this->reader_;
      pMVar6 = &this->handler_->super_MockNLHandler;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      ReadNumericExpr(this,*pcVar5,false);
      pcVar5 = "unary expression";
    }
  }
  MockNLHandler::OnUnhandled(pMVar6,pcVar5);
  return (NumericExpr)NULL_ID;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }